

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_end_transaction(Pager *pPager,int hasMaster,int bCommit)

{
  u8 uVar1;
  sqlite3_file *pJfd;
  sqlite3_io_methods *psVar2;
  long lVar3;
  PCache *pPVar4;
  Wal *pWVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_RAX;
  PgHdr *pPVar9;
  bool bVar10;
  long local_38;
  
  if ((pPager->eState < 2) && (pPager->eLock < 2)) {
    return 0;
  }
  local_38 = in_RAX;
  releaseAllSavepoints(pPager);
  pJfd = pPager->jfd;
  psVar2 = pJfd->pMethods;
  iVar6 = 0;
  if (psVar2 != (sqlite3_io_methods *)0x0) {
    iVar6 = 0;
    if (psVar2 == &MemJournalMethods) {
      memjrnlClose(pJfd);
      pJfd->pMethods = (sqlite3_io_methods *)0x0;
    }
    else {
      uVar1 = pPager->journalMode;
      if (uVar1 == '\x01') {
LAB_00161cd3:
        bVar10 = true;
        if (hasMaster == 0) {
          bVar10 = pPager->tempFile != '\0';
        }
        if (pPager->journalOff == 0) {
LAB_00161d06:
          iVar6 = 0;
        }
        else {
          lVar3 = pPager->journalSizeLimit;
          if ((bool)(bVar10 | lVar3 == 0)) {
            iVar6 = (*psVar2->xTruncate)(pJfd,0);
          }
          else {
            iVar6 = (*psVar2->xWrite)(pJfd,zeroJournalHdr_zeroHdr,0x1c,0);
          }
          if ((iVar6 == 0) && (iVar6 = 0, pPager->noSync == '\0')) {
            iVar6 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,pPager->syncFlags | 0x10);
          }
          if (((0 < lVar3 && iVar6 == 0) &&
              (iVar6 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&local_38), iVar6 == 0)) &&
             (iVar6 = 0, lVar3 < local_38)) {
            iVar6 = (*pPager->jfd->pMethods->xTruncate)(pPager->jfd,lVar3);
          }
        }
      }
      else {
        if (uVar1 != '\x03') {
          if ((uVar1 == '\x05') || (pPager->exclusiveMode == '\0')) {
            uVar1 = pPager->tempFile;
            (*psVar2->xClose)(pJfd);
            pJfd->pMethods = (sqlite3_io_methods *)0x0;
            if (uVar1 == '\0') {
              iVar6 = (*pPager->pVfs->xDelete)
                                (pPager->pVfs,pPager->zJournal,(uint)pPager->extraSync);
            }
            goto LAB_00161dc2;
          }
          goto LAB_00161cd3;
        }
        if (pPager->journalOff == 0) goto LAB_00161d06;
        iVar6 = (*psVar2->xTruncate)(pJfd,0);
        if (iVar6 == 0) {
          if (pPager->fullSync == '\0') goto LAB_00161d06;
          iVar6 = 0;
          if (pPager->syncFlags != 0) {
            iVar6 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,(uint)pPager->syncFlags);
          }
        }
      }
      pPager->journalOff = 0;
    }
  }
LAB_00161dc2:
  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = (Bitvec *)0x0;
  pPager->nRec = 0;
  if (iVar6 == 0) {
    if ((pPager->memDb == '\0') && (iVar7 = pagerFlushOnCommit(pPager,bCommit), iVar7 == 0)) {
      pPVar4 = pPager->pPCache;
      for (pPVar9 = pPVar4->pDirty; pPVar9 != (PgHdr *)0x0; pPVar9 = pPVar9->pDirtyNext) {
        *(byte *)&pPVar9->flags = (byte)pPVar9->flags & 0xf3;
      }
      pPVar4->pSynced = pPVar4->pDirtyTail;
    }
    else {
      pPVar4 = pPager->pPCache;
      while (pPVar9 = pPVar4->pDirty, pPVar9 != (PgHdr *)0x0) {
        sqlite3PcacheMakeClean(pPVar9);
      }
    }
    sqlite3PcacheTruncate(pPager->pPCache,pPager->dbSize);
  }
  if (pPager->pWal == (Wal *)0x0) {
    if ((bCommit != 0) && (iVar6 == 0)) {
      iVar6 = 0;
      if (pPager->dbSize < pPager->dbFileSize) {
        iVar6 = pager_truncate(pPager,pPager->dbSize);
      }
    }
  }
  else {
    sqlite3WalEndWriteTransaction(pPager->pWal);
  }
  if ((bCommit != 0) && (iVar6 == 0)) {
    psVar2 = pPager->fd->pMethods;
    if (psVar2 == (sqlite3_io_methods *)0x0) {
      iVar7 = 0xc;
    }
    else {
      iVar7 = (*psVar2->xFileControl)(pPager->fd,0x16,(void *)0x0);
    }
    iVar6 = 0;
    if (iVar7 != 0xc) {
      iVar6 = iVar7;
    }
  }
  iVar7 = 0;
  if (pPager->exclusiveMode != '\0') goto LAB_00161f1c;
  pWVar5 = pPager->pWal;
  if (pWVar5 != (Wal *)0x0) {
    iVar7 = 0;
    if (pWVar5->exclusiveMode == '\0') goto LAB_00161f1c;
    pWVar5->exclusiveMode = '\0';
    iVar8 = (*pWVar5->pDbFd->pMethods->xShmLock)(pWVar5->pDbFd,pWVar5->readLock + 3,1,6);
    if (iVar8 != 0) {
      pWVar5->exclusiveMode = '\x01';
    }
    if (pWVar5->exclusiveMode != '\0') goto LAB_00161f1c;
  }
  psVar2 = pPager->fd->pMethods;
  iVar7 = 0;
  if (psVar2 != (sqlite3_io_methods *)0x0) {
    if (pPager->noLock == '\0') {
      iVar7 = (*psVar2->xUnlock)(pPager->fd,1);
    }
    if (pPager->eLock != '\x05') {
      pPager->eLock = '\x01';
    }
  }
  pPager->changeCountDone = '\0';
LAB_00161f1c:
  pPager->eState = '\x01';
  pPager->setMaster = '\0';
  if (iVar6 != 0) {
    iVar7 = iVar6;
  }
  return iVar7;
}

Assistant:

static int pager_end_transaction(Pager *pPager, int hasMaster, int bCommit){
  int rc = SQLITE_OK;      /* Error code from journal finalization operation */
  int rc2 = SQLITE_OK;     /* Error code from db file unlock operation */

  /* Do nothing if the pager does not have an open write transaction
  ** or at least a RESERVED lock. This function may be called when there
  ** is no write-transaction active but a RESERVED or greater lock is
  ** held under two circumstances:
  **
  **   1. After a successful hot-journal rollback, it is called with
  **      eState==PAGER_NONE and eLock==EXCLUSIVE_LOCK.
  **
  **   2. If a connection with locking_mode=exclusive holding an EXCLUSIVE 
  **      lock switches back to locking_mode=normal and then executes a
  **      read-transaction, this function is called with eState==PAGER_READER 
  **      and eLock==EXCLUSIVE_LOCK when the read-transaction is closed.
  */
  assert( assert_pager_state(pPager) );
  assert( pPager->eState!=PAGER_ERROR );
  if( pPager->eState<PAGER_WRITER_LOCKED && pPager->eLock<RESERVED_LOCK ){
    return SQLITE_OK;
  }

  releaseAllSavepoints(pPager);
  assert( isOpen(pPager->jfd) || pPager->pInJournal==0 
      || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_BATCH_ATOMIC)
  );
  if( isOpen(pPager->jfd) ){
    assert( !pagerUseWal(pPager) );

    /* Finalize the journal file. */
    if( sqlite3JournalIsInMemory(pPager->jfd) ){
      /* assert( pPager->journalMode==PAGER_JOURNALMODE_MEMORY ); */
      sqlite3OsClose(pPager->jfd);
    }else if( pPager->journalMode==PAGER_JOURNALMODE_TRUNCATE ){
      if( pPager->journalOff==0 ){
        rc = SQLITE_OK;
      }else{
        rc = sqlite3OsTruncate(pPager->jfd, 0);
        if( rc==SQLITE_OK && pPager->fullSync ){
          /* Make sure the new file size is written into the inode right away.
          ** Otherwise the journal might resurrect following a power loss and
          ** cause the last transaction to roll back.  See
          ** https://bugzilla.mozilla.org/show_bug.cgi?id=1072773
          */
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
        }
      }
      pPager->journalOff = 0;
    }else if( pPager->journalMode==PAGER_JOURNALMODE_PERSIST
      || (pPager->exclusiveMode && pPager->journalMode!=PAGER_JOURNALMODE_WAL)
    ){
      rc = zeroJournalHdr(pPager, hasMaster||pPager->tempFile);
      pPager->journalOff = 0;
    }else{
      /* This branch may be executed with Pager.journalMode==MEMORY if
      ** a hot-journal was just rolled back. In this case the journal
      ** file should be closed and deleted. If this connection writes to
      ** the database file, it will do so using an in-memory journal.
      */
      int bDelete = !pPager->tempFile;
      assert( sqlite3JournalIsInMemory(pPager->jfd)==0 );
      assert( pPager->journalMode==PAGER_JOURNALMODE_DELETE 
           || pPager->journalMode==PAGER_JOURNALMODE_MEMORY 
           || pPager->journalMode==PAGER_JOURNALMODE_WAL 
      );
      sqlite3OsClose(pPager->jfd);
      if( bDelete ){
        rc = sqlite3OsDelete(pPager->pVfs, pPager->zJournal, pPager->extraSync);
      }
    }
  }

#ifdef SQLITE_CHECK_PAGES
  sqlite3PcacheIterateDirty(pPager->pPCache, pager_set_pagehash);
  if( pPager->dbSize==0 && sqlite3PcacheRefCount(pPager->pPCache)>0 ){
    PgHdr *p = sqlite3PagerLookup(pPager, 1);
    if( p ){
      p->pageHash = 0;
      sqlite3PagerUnrefNotNull(p);
    }
  }
#endif

  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = 0;
  pPager->nRec = 0;
  if( rc==SQLITE_OK ){
    if( MEMDB || pagerFlushOnCommit(pPager, bCommit) ){
      sqlite3PcacheCleanAll(pPager->pPCache);
    }else{
      sqlite3PcacheClearWritable(pPager->pPCache);
    }
    sqlite3PcacheTruncate(pPager->pPCache, pPager->dbSize);
  }

  if( pagerUseWal(pPager) ){
    /* Drop the WAL write-lock, if any. Also, if the connection was in 
    ** locking_mode=exclusive mode but is no longer, drop the EXCLUSIVE 
    ** lock held on the database file.
    */
    rc2 = sqlite3WalEndWriteTransaction(pPager->pWal);
    assert( rc2==SQLITE_OK );
  }else if( rc==SQLITE_OK && bCommit && pPager->dbFileSize>pPager->dbSize ){
    /* This branch is taken when committing a transaction in rollback-journal
    ** mode if the database file on disk is larger than the database image.
    ** At this point the journal has been finalized and the transaction 
    ** successfully committed, but the EXCLUSIVE lock is still held on the
    ** file. So it is safe to truncate the database file to its minimum
    ** required size.  */
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    rc = pager_truncate(pPager, pPager->dbSize);
  }

  if( rc==SQLITE_OK && bCommit ){
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_COMMIT_PHASETWO, 0);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  }

  if( !pPager->exclusiveMode 
   && (!pagerUseWal(pPager) || sqlite3WalExclusiveMode(pPager->pWal, 0))
  ){
    rc2 = pagerUnlockDb(pPager, SHARED_LOCK);
    pPager->changeCountDone = 0;
  }
  pPager->eState = PAGER_READER;
  pPager->setMaster = 0;

  return (rc==SQLITE_OK?rc2:rc);
}